

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::BaseBuilder::align(BaseBuilder *this,AlignMode alignMode,uint32_t alignment)

{
  undefined4 in_EDX;
  undefined1 in_SIL;
  BaseBuilder *in_RDI;
  Error _err;
  AlignNode *node;
  AlignNode **in_stack_ffffffffffffffc8;
  BaseNode *in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffec;
  undefined4 uVar1;
  Error local_4;
  
  uVar1 = CONCAT13(in_SIL,in_stack_ffffffffffffffec);
  if ((in_RDI->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    local_4 = DebugUtils::errored(5);
  }
  else {
    local_4 = newAlignNode(in_RDI,in_stack_ffffffffffffffc8,kCode,0x11636e);
    if (local_4 == 0) {
      addNode((BaseBuilder *)CONCAT44(uVar1,in_EDX),in_stack_ffffffffffffffe0);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

Error BaseBuilder::align(AlignMode alignMode, uint32_t alignment) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  AlignNode* node;
  ASMJIT_PROPAGATE(newAlignNode(&node, alignMode, alignment));
  ASMJIT_ASSUME(node != nullptr);

  addNode(node);
  return kErrorOk;
}